

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_json_mapping_api.cpp
# Opt level: O3

string * __thiscall
cfd::js::api::json::
ExecuteJsonApi<cfd::js::api::json::PrivkeyHexData,cfd::js::api::json::PrivkeyWifData,cfd::js::api::PrivkeyHexDataStruct,cfd::js::api::PrivkeyWifDataStruct>
          (string *__return_storage_ptr__,json *this,string *request_message,
          function<cfd::js::api::PrivkeyWifDataStruct_(const_cfd::js::api::PrivkeyHexDataStruct_&)>
          *call_function)

{
  json *pjVar1;
  undefined8 uVar2;
  PrivkeyHexDataStruct request;
  PrivkeyWifDataStruct response;
  PrivkeyWifData res;
  PrivkeyHexData req;
  string local_330;
  PrivkeyHexDataStruct local_310;
  PrivkeyWifDataStruct local_220;
  ErrorResponse local_158;
  PrivkeyHexData local_a0;
  
  PrivkeyHexData::PrivkeyHexData(&local_a0);
  core::JsonClassBase<cfd::js::api::json::PrivkeyHexData>::Deserialize
            (&local_a0.super_JsonClassBase<cfd::js::api::json::PrivkeyHexData>,(string *)this);
  PrivkeyHexData::ConvertToStruct(&local_310,&local_a0);
  if ((request_message->field_2)._M_allocated_capacity != 0) {
    (**(code **)((long)&request_message->field_2 + 8))(&local_220,request_message,&local_310);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    if (local_220.error.code == 0) {
      PrivkeyWifData::PrivkeyWifData((PrivkeyWifData *)&local_158);
      PrivkeyWifData::ConvertFromStruct((PrivkeyWifData *)&local_158,&local_220);
      core::JsonClassBase<cfd::js::api::json::PrivkeyWifData>::Serialize_abi_cxx11_
                (&local_330,(JsonClassBase<cfd::js::api::json::PrivkeyWifData> *)&local_158);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_330);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_330._M_dataplus._M_p != &local_330.field_2) {
        operator_delete(local_330._M_dataplus._M_p);
      }
      PrivkeyWifData::~PrivkeyWifData((PrivkeyWifData *)&local_158);
    }
    else {
      ErrorResponse::ConvertFromStruct(&local_158,&local_220.error);
      core::JsonClassBase<cfd::js::api::json::ErrorResponseBase>::Serialize_abi_cxx11_
                (&local_330,(JsonClassBase<cfd::js::api::json::ErrorResponseBase> *)&local_158);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_330);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_330._M_dataplus._M_p != &local_330.field_2) {
        operator_delete(local_330._M_dataplus._M_p);
      }
      local_158.super_ErrorResponseBase.super_JsonClassBase<cfd::js::api::json::ErrorResponseBase>.
      _vptr_JsonClassBase = (_func_int **)&PTR__ErrorResponseBase_00a78a38;
      InnerErrorResponse::~InnerErrorResponse(&local_158.super_ErrorResponseBase.error_);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&local_158.super_ErrorResponseBase.ignore_items._M_t);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_220.ignore_items._M_t);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_220.error.ignore_items._M_t);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220.error.message._M_dataplus._M_p != &local_220.error.message.field_2) {
      operator_delete(local_220.error.message._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220.error.type._M_dataplus._M_p != &local_220.error.type.field_2) {
      operator_delete(local_220.error.type._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220.wif._M_dataplus._M_p != &local_220.wif.field_2) {
      operator_delete(local_220.wif._M_dataplus._M_p);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_310.ignore_items._M_t);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_310.error.ignore_items._M_t);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_310.error.message._M_dataplus._M_p != &local_310.error.message.field_2) {
      operator_delete(local_310.error.message._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_310.error.type._M_dataplus._M_p != &local_310.error.type.field_2) {
      operator_delete(local_310.error.type._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_310.network._M_dataplus._M_p != &local_310.network.field_2) {
      operator_delete(local_310.network._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_310.hex._M_dataplus._M_p != &local_310.hex.field_2) {
      operator_delete(local_310.hex._M_dataplus._M_p);
    }
    PrivkeyHexData::~PrivkeyHexData(&local_a0);
    return __return_storage_ptr__;
  }
  uVar2 = std::__throw_bad_function_call();
  PrivkeyWifData::~PrivkeyWifData((PrivkeyWifData *)&local_158);
  pjVar1 = (json *)(__return_storage_ptr__->_M_dataplus)._M_p;
  if (pjVar1 != this) {
    operator_delete(pjVar1);
  }
  PrivkeyWifDataStruct::~PrivkeyWifDataStruct(&local_220);
  PrivkeyHexDataStruct::~PrivkeyHexDataStruct(&local_310);
  PrivkeyHexData::~PrivkeyHexData(&local_a0);
  _Unwind_Resume(uVar2);
}

Assistant:

std::string ExecuteJsonApi(
    const std::string &request_message,
    std::function<ResponseStructType(const RequestStructType &)>
        call_function) {
  // リクエストjson_strから、モデルへ変換
  RequestType req;
  try {
    req.Deserialize(request_message);
  } catch (const CfdException &cfd_except) {
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(cfd_except);
    return res.Serialize();
  } catch (...) {
    CfdException ex(
        CfdError::kCfdOutOfRangeError,
        "JSON value convert error. Value out of range.");
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(ex);
    return res.Serialize();
  }
  RequestStructType request = req.ConvertToStruct();
  ResponseStructType response = call_function(request);
  std::string json_message;
  if (response.error.code == 0) {
    ResponseType res;
    res.ConvertFromStruct(response);
    json_message = res.Serialize();
  } else {
    json_message =
        ErrorResponse::ConvertFromStruct(response.error).Serialize();
  }

  // utf-8
  return json_message;
}